

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

int countSelected(atom *theAtoms,int srcFlag)

{
  int iVar1;
  
  iVar1 = 0;
  for (; theAtoms != (atom *)0x0; theAtoms = theAtoms->next) {
    iVar1 = (iVar1 + 1) - (uint)((theAtoms->flags & srcFlag) == 0);
  }
  return iVar1;
}

Assistant:

int countSelected(atom *theAtoms, int srcFlag)
{
   atom *a = NULL;
   int ns = 0;
   for(a = theAtoms; a; a = a->next) {
      if (a->flags & srcFlag) { ns++; }
   }
   return ns;
}